

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-flooding.c
# Opt level: O0

void mpr_calculate_neighbor_graph_flooding(nhdp_domain *domain,mpr_flooding_data *data)

{
  mpr_flooding_data *data_local;
  nhdp_domain *domain_local;
  
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0x115,0,0,
             "Calculate neighbor graph for flooding MPRs");
  }
  mpr_init_neighbor_graph(&data->neigh_graph,&_api_interface);
  _calculate_n1(domain,data);
  _calculate_n2(domain,data);
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_flooding(const struct nhdp_domain *domain, struct mpr_flooding_data *data) {
  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for flooding MPRs");

  mpr_init_neighbor_graph(&data->neigh_graph, &_api_interface);
  _calculate_n1(domain, data);
  _calculate_n2(domain, data);
}